

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_bam_from_start.cc
# Opt level: O0

int parse_bam_from_start(int argc,char **argv)

{
  uint8_t *puVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  uint8_t *puVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  int iVar7;
  ulong uVar8;
  char *pcVar9;
  htsFile *fp;
  runtime_error *prVar10;
  bam_hdr_t *h;
  bam1_t *b;
  ostream *poVar11;
  uint local_10c;
  int i;
  uint8_t *seqi;
  uint8_t *quali;
  string qual;
  string seq;
  bam1_t *aln;
  bam_hdr_t *header;
  samFile *in;
  string local_98 [39];
  allocator<char> local_71;
  string local_70 [8];
  string region_;
  allocator<char> local_39;
  string local_38 [8];
  string bam;
  char **argv_local;
  int argc_local;
  
  bam.field_2._8_8_ = argv;
  if (argc < 2) {
    argv_local._4_4_ = usage();
  }
  else {
    pcVar9 = argv[1];
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_38,pcVar9,&local_39);
    std::allocator<char>::~allocator(&local_39);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_70,".",&local_71);
    std::allocator<char>::~allocator(&local_71);
    if (2 < argc) {
      pcVar9 = *(char **)(bam.field_2._8_8_ + 0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_98,pcVar9,(allocator<char> *)((long)&in + 7));
      std::__cxx11::string::operator=(local_70,local_98);
      std::__cxx11::string::~string(local_98);
      std::allocator<char>::~allocator((allocator<char> *)((long)&in + 7));
    }
    uVar8 = std::__cxx11::string::empty();
    if ((uVar8 & 1) == 0) {
      pcVar9 = (char *)std::__cxx11::string::c_str();
      fp = hts_open(pcVar9,"r");
      if (fp == (htsFile *)0x0) {
        prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar10,"Unable to open BAM/SAM file.");
        __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      h = sam_hdr_read(fp);
      if (h == (bam_hdr_t *)0x0) {
        hts_close(fp);
        prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar10,"Unable to open BAM header.");
        __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      b = bam_init1();
      while( true ) {
        iVar7 = sam_read1(fp,h,b);
        if (iVar7 < 0) break;
        poVar11 = std::operator<<((ostream *)&std::cout,"Read Chr: ");
        std::operator<<(poVar11,h->target_name[(b->core).tid]);
        poVar11 = std::operator<<((ostream *)&std::cout,"\tPos: ");
        std::ostream::operator<<(poVar11,(b->core).pos);
        std::__cxx11::string::string((string *)(qual.field_2._M_local_buf + 8));
        std::__cxx11::string::string((string *)&quali);
        puVar1 = b->data;
        uVar2 = *(undefined8 *)&(b->core).field_0x8;
        uVar3 = *(undefined8 *)&(b->core).field_0x8;
        iVar7 = (b->core).l_qseq;
        puVar4 = b->data;
        uVar5 = *(undefined8 *)&(b->core).field_0x8;
        uVar6 = *(undefined8 *)&(b->core).field_0x8;
        for (local_10c = 0; (int)local_10c < (b->core).l_qseq; local_10c = local_10c + 1) {
          std::__cxx11::string::operator+=
                    ((string *)(qual.field_2._M_local_buf + 8),
                     "=ACMGRSVTWYHKDBN"
                     [puVar4[(long)((int)local_10c >> 1) +
                             (long)(int)((uint)((ulong)uVar6 >> 0x18) & 0xff) +
                             (long)(int)((uint)(ushort)((ulong)uVar5 >> 0x30) << 2)] >>
                      (sbyte)((~local_10c & 1) << 2) & 0xf]);
          std::__cxx11::string::operator+=
                    ((string *)&quali,
                     puVar1[(long)(int)local_10c +
                            (long)(iVar7 + 1 >> 1) +
                            (long)(int)((uint)((ulong)uVar3 >> 0x18) & 0xff) +
                            (long)(int)((uint)(ushort)((ulong)uVar2 >> 0x30) << 2)] + '!');
        }
        poVar11 = std::operator<<((ostream *)&std::cout,"\tSeq: ");
        poVar11 = std::operator<<(poVar11,(string *)(qual.field_2._M_local_buf + 8));
        poVar11 = std::operator<<(poVar11,"\tQual: ");
        std::operator<<(poVar11,(string *)&quali);
        std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string((string *)&quali);
        std::__cxx11::string::~string((string *)(qual.field_2._M_local_buf + 8));
      }
      bam_destroy1(b);
      bam_hdr_destroy(h);
      hts_close(fp);
    }
    argv_local._4_4_ = 0;
    std::__cxx11::string::~string(local_70);
    std::__cxx11::string::~string(local_38);
  }
  return argv_local._4_4_;
}

Assistant:

int parse_bam_from_start(int argc, char* argv[]) {
    if(argc < 2) {
        return usage();
    }
    string bam = string(argv[1]);
    string region_ = ".";
    if(argc > 2) {
        region_ = string(argv[2]);
    }
    if(!bam.empty()) {
        //open BAM for reading
        samFile *in = sam_open(bam.c_str(), "r");
        if(in == NULL) {
            throw runtime_error("Unable to open BAM/SAM file.");
        }
        //Get the header
        bam_hdr_t *header = sam_hdr_read(in);
        if(header == NULL) {
            sam_close(in);
            throw runtime_error("Unable to open BAM header.");
        }
        //Initiate the alignment record
        bam1_t *aln = bam_init1();
        while(sam_read1(in, header, aln) >= 0) {
            cout << "Read Chr: " << header->target_name[aln->core.tid];
            cout << "\tPos: " << aln->core.pos;
            string seq, qual;
            uint8_t *quali = bam_get_qual(aln);
            uint8_t *seqi = bam_get_seq(aln);
            for (int i = 0; i < aln->core.l_qseq; i++) {
                seq += seq_nt16_str[bam_seqi(seqi, i)];
                qual += 33 + quali[i];
            }
            cout << "\tSeq: " << seq << "\tQual: " << qual;
            cout << endl;
        }
        bam_destroy1(aln);
        bam_hdr_destroy(header);
        sam_close(in);
    }
    return 0;
}